

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialize.c
# Opt level: O1

void gas_parameters_Initialize(Gas_parameters *parameters)

{
  parameters->time_upper_boundary = 1.0;
  parameters->space_upper_boundary = 10.0;
  parameters->p_ro = 10.0;
  parameters->viscosity = 0.1;
  parameters->artificial_viscosity = 5.0;
  return;
}

Assistant:

void gas_parameters_Initialize (Gas_parameters * parameters) {
  parameters->time_upper_boundary   = 1.;
  parameters->space_upper_boundary  = 10.;
  parameters->p_ro                  = 10.;
  parameters->viscosity             = 0.1;
  parameters->artificial_viscosity  = 5;
  return;
}